

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbenchmark.cpp
# Opt level: O0

QBenchmarkMeasurerBase * __thiscall QBenchmarkGlobalData::createMeasurer(QBenchmarkGlobalData *this)

{
  long in_RDI;
  QBenchmarkMeasurerBase *measurer;
  QBenchmarkPerfEventsMeasurer *in_stack_ffffffffffffffb0;
  QBenchmarkEvent *in_stack_ffffffffffffffc0;
  undefined8 local_10;
  
  if ((*(int *)(in_RDI + 0x6c) == 2) || (*(int *)(in_RDI + 0x6c) == 1)) {
    local_10 = (QBenchmarkTimeMeasurer *)operator_new(8);
    QBenchmarkCallgrindMeasurer::QBenchmarkCallgrindMeasurer
              ((QBenchmarkCallgrindMeasurer *)in_stack_ffffffffffffffb0);
  }
  else if (*(int *)(in_RDI + 0x6c) == 3) {
    local_10 = (QBenchmarkTimeMeasurer *)operator_new(0x20);
    QBenchmarkPerfEventsMeasurer::QBenchmarkPerfEventsMeasurer(in_stack_ffffffffffffffb0);
  }
  else if (*(int *)(in_RDI + 0x6c) == 4) {
    local_10 = (QBenchmarkTimeMeasurer *)operator_new(0x10);
    QBenchmarkTickMeasurer::QBenchmarkTickMeasurer
              ((QBenchmarkTickMeasurer *)in_stack_ffffffffffffffb0);
  }
  else if (*(int *)(in_RDI + 0x6c) == 5) {
    local_10 = (QBenchmarkTimeMeasurer *)operator_new(0x20);
    QBenchmarkEvent::QBenchmarkEvent(in_stack_ffffffffffffffc0);
  }
  else {
    local_10 = (QBenchmarkTimeMeasurer *)operator_new(0x18);
    QBenchmarkTimeMeasurer::QBenchmarkTimeMeasurer(local_10);
  }
  return &local_10->super_QBenchmarkMeasurerBase;
}

Assistant:

QBenchmarkMeasurerBase * QBenchmarkGlobalData::createMeasurer()
{
    QBenchmarkMeasurerBase *measurer = nullptr;
    if (0) {
#if QT_CONFIG(valgrind)
    } else if (mode_ == CallgrindChildProcess || mode_ == CallgrindParentProcess) {
        measurer = new QBenchmarkCallgrindMeasurer;
#endif
#ifdef QTESTLIB_USE_PERF_EVENTS
    } else if (mode_ == PerfCounter) {
        measurer = new QBenchmarkPerfEventsMeasurer;
#endif
#ifdef HAVE_TICK_COUNTER
    } else if (mode_ == TickCounter) {
        measurer = new QBenchmarkTickMeasurer;
#endif
    } else if (mode_ == EventCounter) {
        measurer = new QBenchmarkEvent;
    } else {
        measurer =  new QBenchmarkTimeMeasurer;
    }
    return measurer;
}